

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O2

int __thiscall zmq::ipc_listener_t::set_local_address(ipc_listener_t *this,char *addr_)

{
  string *addr__00;
  socket_base_t *this_00;
  int iVar1;
  int iVar2;
  fd_t __fd;
  socklen_t __len;
  int iVar3;
  int *piVar4;
  sockaddr *__addr;
  string addr;
  ipc_address_t address;
  endpoint_uri_pair_t local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,addr_,(allocator<char> *)&address);
  if ((this->super_stream_listener_base_t).super_own_t.options.use_fd == -1) {
    if (*addr._M_dataplus._M_p == '*') {
      iVar1 = create_ipc_wildcard_address(&this->_tmp_socket_dirname,&addr);
      if (iVar1 < 0) {
        iVar1 = -1;
        goto LAB_0017369e;
      }
      if ((this->super_stream_listener_base_t).super_own_t.options.use_fd != -1) goto LAB_001735b0;
    }
    unlink(addr._M_dataplus._M_p);
  }
LAB_001735b0:
  (this->_filename)._M_string_length = 0;
  *(this->_filename)._M_dataplus._M_p = '\0';
  ipc_address_t::ipc_address_t(&address);
  iVar2 = ipc_address_t::resolve(&address,addr._M_dataplus._M_p);
  iVar1 = -1;
  if (iVar2 == 0) {
    addr__00 = &(this->super_stream_listener_base_t)._endpoint;
    ipc_address_t::to_string(&address,addr__00);
    iVar2 = (this->super_stream_listener_base_t).super_own_t.options.use_fd;
    if (iVar2 == -1) {
      __fd = open_socket(1,1,0);
      (this->super_stream_listener_base_t)._s = __fd;
      if (__fd == -1) goto LAB_001735e1;
      __addr = ipc_address_t::addr(&address);
      __len = ipc_address_t::addrlen(&address);
      iVar3 = bind(__fd,(sockaddr *)__addr,__len);
      iVar2 = (int)__addr;
      if (iVar3 == 0) {
        iVar2 = (this->super_stream_listener_base_t).super_own_t.options.backlog;
        iVar3 = listen((this->super_stream_listener_base_t)._s,iVar2);
        if (iVar3 == 0) goto LAB_00173642;
      }
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      close(this,iVar2);
      goto LAB_00173618;
    }
    (this->super_stream_listener_base_t)._s = iVar2;
LAB_00173642:
    std::__cxx11::string::operator=((string *)&this->_filename,(string *)&addr);
    this->_has_file = true;
    this_00 = (this->super_stream_listener_base_t)._socket;
    make_unconnected_bind_endpoint_pair(&local_70,addr__00);
    socket_base_t::event_listening(this_00,&local_70,(this->super_stream_listener_base_t)._s);
    endpoint_uri_pair_t::~endpoint_uri_pair_t(&local_70);
    iVar1 = 0;
  }
  else {
LAB_001735e1:
    if ((this->_tmp_socket_dirname)._M_string_length != 0) {
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      rmdir((this->_tmp_socket_dirname)._M_dataplus._M_p);
      (this->_tmp_socket_dirname)._M_string_length = 0;
      *(this->_tmp_socket_dirname)._M_dataplus._M_p = '\0';
LAB_00173618:
      *piVar4 = iVar3;
    }
  }
  ipc_address_t::~ipc_address_t(&address);
LAB_0017369e:
  std::__cxx11::string::~string((string *)&addr);
  return iVar1;
}

Assistant:

int zmq::ipc_listener_t::set_local_address (const char *addr_)
{
    //  Create addr on stack for auto-cleanup
    std::string addr (addr_);

    //  Allow wildcard file
    if (options.use_fd == -1 && addr[0] == '*') {
        if (create_ipc_wildcard_address (_tmp_socket_dirname, addr) < 0) {
            return -1;
        }
    }

    //  Get rid of the file associated with the UNIX domain socket that
    //  may have been left behind by the previous run of the application.
    //  MUST NOT unlink if the FD is managed by the user, or it will stop
    //  working after the first client connects. The user will take care of
    //  cleaning up the file after the service is stopped.
    if (options.use_fd == -1) {
        ::unlink (addr.c_str ());
    }
    _filename.clear ();

    //  Initialise the address structure.
    ipc_address_t address;
    int rc = address.resolve (addr.c_str ());
    if (rc != 0) {
        if (!_tmp_socket_dirname.empty ()) {
            // We need to preserve errno to return to the user
            const int tmp_errno = errno;
            ::rmdir (_tmp_socket_dirname.c_str ());
            _tmp_socket_dirname.clear ();
            errno = tmp_errno;
        }
        return -1;
    }

    address.to_string (_endpoint);

    if (options.use_fd != -1) {
        _s = options.use_fd;
    } else {
        //  Create a listening socket.
        _s = open_socket (AF_UNIX, SOCK_STREAM, 0);
        if (_s == retired_fd) {
            if (!_tmp_socket_dirname.empty ()) {
                // We need to preserve errno to return to the user
                const int tmp_errno = errno;
                ::rmdir (_tmp_socket_dirname.c_str ());
                _tmp_socket_dirname.clear ();
                errno = tmp_errno;
            }
            return -1;
        }

        //  Bind the socket to the file path.
        rc = bind (_s, const_cast<sockaddr *> (address.addr ()),
                   address.addrlen ());
        if (rc != 0)
            goto error;

        //  Listen for incoming connections.
        rc = listen (_s, options.backlog);
        if (rc != 0)
            goto error;
    }

    _filename = ZMQ_MOVE (addr);
    _has_file = true;

    _socket->event_listening (make_unconnected_bind_endpoint_pair (_endpoint),
                              _s);
    return 0;

error:
    const int err = errno;
    close ();
    errno = err;
    return -1;
}